

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineVertexInputDivisorStateCreateInfoKHR *create_info,
          ScratchAllocator *alloc)

{
  VkVertexInputBindingDivisorDescription *pVVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_t size;
  
  puVar3 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar3 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar4 = create_info->pNext;
    pVVar1 = create_info->pVertexBindingDivisors;
    puVar3[2] = *(undefined8 *)&create_info->vertexBindingDivisorCount;
    puVar3[3] = pVVar1;
    *puVar3 = uVar2;
    puVar3[1] = pvVar4;
  }
  if (puVar3[3] == 0) {
    return puVar3;
  }
  if ((ulong)create_info->vertexBindingDivisorCount != 0) {
    pVVar1 = create_info->pVertexBindingDivisors;
    size = (ulong)create_info->vertexBindingDivisorCount << 3;
    pvVar4 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (pvVar4 != (void *)0x0) {
      memmove(pvVar4,pVVar1,size);
      goto LAB_00120a67;
    }
  }
  pvVar4 = (void *)0x0;
LAB_00120a67:
  puVar3[3] = pvVar4;
  return puVar3;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(
		const VkPipelineVertexInputDivisorStateCreateInfoKHR *create_info,
		ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pVertexBindingDivisors)
	{
		info->pVertexBindingDivisors = copy(create_info->pVertexBindingDivisors,
		                                    create_info->vertexBindingDivisorCount,
		                                    alloc);
	}

	return info;
}